

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReportUnexpectedOpcode
          (BinaryReader *this,Opcode opcode,char *where)

{
  iterator __begin2;
  byte *pbVar1;
  Opcode opcode_local;
  string message;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  string local_50;
  
  opcode_local = opcode;
  std::__cxx11::string::string((string *)&message,"unexpected opcode",(allocator *)&local_50);
  if (where != (char *)0x0) {
    std::__cxx11::string::push_back((char)&message);
    std::__cxx11::string::append((char *)&message);
  }
  std::__cxx11::string::append((char *)&message);
  Opcode::GetBytes(&bytes,&opcode_local);
  if (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    for (pbVar1 = bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pbVar1 != bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
      StringPrintf_abi_cxx11_(&local_50," 0x%x",(ulong)*pbVar1);
      std::__cxx11::string::append((string *)&message);
      std::__cxx11::string::_M_dispose();
    }
    PrintError(this,"%s",message._M_dataplus._M_p);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::__cxx11::string::_M_dispose();
    return (Result)Error;
  }
  __assert_fail("bytes.size() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-reader.cc"
                ,0xd6,
                "Result wabt::(anonymous namespace)::BinaryReader::ReportUnexpectedOpcode(Opcode, const char *)"
               );
}

Assistant:

Result BinaryReader::ReportUnexpectedOpcode(Opcode opcode,
                                            const char* where) {
  std::string message = "unexpected opcode";
  if (where) {
    message += ' ';
    message += where;
  }

  message += ":";

  std::vector<uint8_t> bytes = opcode.GetBytes();
  assert(bytes.size() > 0);

  for (uint8_t byte: bytes) {
    message += StringPrintf(" 0x%x", byte);
  }

  PrintError("%s", message.c_str());
  return Result::Error;
}